

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::run(search *sch,multi_ex *ec)

{
  task_data *ptVar1;
  v_array<unsigned_long> *pvVar2;
  ostream *poVar3;
  size_type sVar4;
  ulong uVar5;
  stringstream *psVar6;
  unsigned_long *puVar7;
  v_array<unsigned_long> *in_RSI;
  search *in_RDI;
  search *unaff_retaddr;
  size_t i_1;
  size_t i;
  v_array<unsigned_long> predictions;
  task_data *my_task_data;
  unsigned_long *in_stack_ffffffffffffff88;
  v_array<unsigned_long> *in_stack_ffffffffffffff90;
  ulong local_50;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 isLdf;
  v_array<unsigned_long> *pvVar8;
  v_array<unsigned_long> *predictions_00;
  multi_ex *in_stack_ffffffffffffffc8;
  search *in_stack_ffffffffffffffd0;
  
  ptVar1 = Search::search::get_task_data<EntityRelationTask::task_data>(in_RDI);
  v_init<unsigned_long>();
  pvVar8 = (v_array<unsigned_long> *)0x0;
  while( true ) {
    isLdf = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
    predictions_00 = pvVar8;
    pvVar2 = (v_array<unsigned_long> *)
             std::vector<example_*,_std::allocator<example_*>_>::size
                       ((vector<example_*,_std::allocator<example_*>_> *)in_RSI);
    if (pvVar2 <= pvVar8) break;
    in_stack_ffffffffffffffb8 = 0;
    v_array<unsigned_long>::push_back(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    pvVar8 = (v_array<unsigned_long> *)((long)&predictions_00->_begin + 1);
  }
  switch(ptVar1->search_order) {
  case 0:
    entity_first_decoding
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,predictions_00,(bool)isLdf);
    break;
  case 1:
    er_mixed_decoding(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,predictions_00);
    break;
  case 2:
    er_allow_skip_decoding(unaff_retaddr,(multi_ex *)in_RDI,in_RSI);
    break;
  case 3:
    entity_first_decoding
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,predictions_00,(bool)isLdf);
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cerr,"search order ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar1->search_order);
    poVar3 = std::operator<<(poVar3,"is undefined.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_50 = 0;
      sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size
                        ((vector<example_*,_std::allocator<example_*>_> *)in_RSI), local_50 < sVar4;
      local_50 = local_50 + 1) {
    Search::search::output_abi_cxx11_(in_RDI);
    uVar5 = std::ios::good();
    if ((uVar5 & 1) != 0) {
      psVar6 = Search::search::output_abi_cxx11_(in_RDI);
      in_stack_ffffffffffffff90 = (v_array<unsigned_long> *)(psVar6 + 0x10);
      puVar7 = v_array<unsigned_long>::operator[]
                         ((v_array<unsigned_long> *)&stack0xffffffffffffffc8,local_50);
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff90,*puVar7);
      std::operator<<(poVar3,' ');
    }
  }
  v_array<unsigned_long>::delete_v(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();

  v_array<size_t> predictions = v_init<size_t>();
  for (size_t i = 0; i < ec.size(); i++)
  {
    predictions.push_back(0);
  }

  switch (my_task_data->search_order)
  {
    case 0:
      entity_first_decoding(sch, ec, predictions, false);
      break;
    case 1:
      er_mixed_decoding(sch, ec, predictions);
      break;
    case 2:
      er_allow_skip_decoding(sch, ec, predictions);
      break;
    case 3:
      entity_first_decoding(sch, ec, predictions, true);  // LDF = true
      break;
    default:
      cerr << "search order " << my_task_data->search_order << "is undefined." << endl;
  }

  for (size_t i = 0; i < ec.size(); i++)
  {
    if (sch.output().good())
      sch.output() << predictions[i] << ' ';
  }
  predictions.delete_v();
}